

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

gboolean watch_jacklistener(GList **players)

{
  long lVar1;
  GDBusProxy *headphone;
  GDBusConnection *bus;
  GError *error;
  GList **players_local;
  
  bus = (GDBusConnection *)0x0;
  error = (GError *)players;
  lVar1 = g_bus_get_sync(1,0,&bus);
  if (lVar1 == 0) {
    g_log(0,8,"%s",*(undefined8 *)(bus + 8));
    g_error_free(bus);
    players_local._4_4_ = 0;
  }
  else {
    lVar1 = g_dbus_proxy_new_sync
                      (lVar1,0,0,"org.ude.jacklistener","/jack/headphone","org.ude.jacklistener",0,
                       &bus);
    if (lVar1 == 0) {
      g_log(0,8,"%s",*(undefined8 *)(bus + 8));
      g_error_free(bus);
      players_local._4_4_ = 0;
    }
    else {
      g_signal_connect_data(lVar1,"g-signal",on_jacklistener_signal,error,0,0);
    }
  }
  return players_local._4_4_;
}

Assistant:

gboolean
watch_jacklistener(GList** players)
{
  GError *error = NULL;
  GDBusConnection *bus = g_bus_get_sync(G_BUS_TYPE_SYSTEM, NULL, &error);

  if (!bus) {
    g_critical("%s", error->message);
    g_error_free(error);
    return FALSE;
  }

  GDBusProxy* headphone = g_dbus_proxy_new_sync(bus,
                                                G_DBUS_PROXY_FLAGS_NONE,
                                                NULL, // interface info, XXX
                                                "org.ude.jacklistener",
                                                "/jack/headphone",
                                                "org.ude.jacklistener",
                                                NULL, // cancellable
                                                &error);
  if (!headphone) {
    g_critical("%s", error->message);
    g_error_free(error);
    return FALSE;
  }

  g_signal_connect(headphone, "g-signal", G_CALLBACK(on_jacklistener_signal), players);
}